

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mpi_select(mbedtls_mpi *R,mbedtls_mpi *T,size_t T_size,size_t idx)

{
  int iVar1;
  mbedtls_ct_condition_t mVar2;
  mbedtls_ct_uint_t local_38;
  size_t i;
  int ret;
  size_t idx_local;
  size_t T_size_local;
  mbedtls_mpi *T_local;
  mbedtls_mpi *R_local;
  
  i._4_4_ = -0x6e;
  local_38 = 0;
  while( true ) {
    if (T_size <= local_38) {
      return i._4_4_;
    }
    mVar2 = mbedtls_ct_uint_eq(local_38,idx);
    iVar1 = mbedtls_mpi_safe_cond_assign(R,T + local_38,(uchar)mVar2);
    if (iVar1 != 0) break;
    local_38 = local_38 + 1;
    i._4_4_ = 0;
  }
  return iVar1;
}

Assistant:

static int mpi_select(mbedtls_mpi *R, const mbedtls_mpi *T, size_t T_size, size_t idx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for (size_t i = 0; i < T_size; i++) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_safe_cond_assign(R, &T[i],
                                                     (unsigned char) mbedtls_ct_uint_eq(i, idx)));
    }
cleanup:
    return ret;
}